

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

HelicsCore helicsCreateCore(char *type,char *name,char *initString,HelicsError *err)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  size_type sVar1;
  string_view type_00;
  CoreType type_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type *psVar7;
  _Head_base<0UL,_helics::CoreObject_*,_false> _Var8;
  _Alloc_hider _Var9;
  string_view coreName;
  string_view newError;
  string_view configureString;
  string_view configureString_00;
  __single_object core;
  element_type *in_stack_ffffffffffffff58;
  MasterObjectHolder *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  size_type local_98;
  undefined8 uStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  __uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  MasterObjectHolder *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (type == (char *)0x0) {
      type_01 = DEFAULT;
    }
    else {
      strlen(type);
      type_00._M_str = (char *)in_stack_ffffffffffffff58;
      type_00._M_len = 0x194f01;
      type_01 = helics::core::coreTypeFromString(type_00);
      if (type_01 == UNRECOGNIZED) {
        if (err != (HelicsError *)0x0) {
          err->error_code = -4;
          getMasterHolder();
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"core type ","");
          pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_60,type);
          local_88._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
          paVar6 = &pbVar2->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p == paVar6) {
            local_88.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_88.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          }
          else {
            local_88.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          }
          local_88._M_string_length = pbVar2->_M_string_length;
          (pbVar2->_M_dataplus)._M_p = (pointer)paVar6;
          pbVar2->_M_string_length = 0;
          (pbVar2->field_2)._M_local_buf[0] = '\0';
          pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_88," is not recognized");
          psVar7 = (size_type *)(pbVar2->_M_dataplus)._M_p;
          paVar6 = &pbVar2->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7 == paVar6) {
            local_98 = paVar6->_M_allocated_capacity;
            uStack_90 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
            psVar7 = &local_98;
          }
          else {
            local_98 = paVar6->_M_allocated_capacity;
          }
          sVar1 = pbVar2->_M_string_length;
          (pbVar2->_M_dataplus)._M_p = (pointer)paVar6;
          pbVar2->_M_string_length = 0;
          (pbVar2->field_2)._M_local_buf[0] = '\0';
          newError._M_str = (char *)psVar7;
          newError._M_len = sVar1;
          pcVar5 = MasterObjectHolder::addErrorString(local_40,newError);
          err->message = pcVar5;
          if (psVar7 != &local_98) {
            operator_delete(psVar7,local_98 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
        }
        goto LAB_00194edd;
      }
    }
    local_88._M_dataplus._M_p = (pointer)operator_new(0x48);
    (((CoreObject *)local_88._M_dataplus._M_p)->translators).
    super__Vector_base<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (((CoreObject *)local_88._M_dataplus._M_p)->translators).
    super__Vector_base<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (((CoreObject *)local_88._M_dataplus._M_p)->filters).
    super__Vector_base<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (((CoreObject *)local_88._M_dataplus._M_p)->translators).
    super__Vector_base<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (((CoreObject *)local_88._M_dataplus._M_p)->filters).
    super__Vector_base<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (((CoreObject *)local_88._M_dataplus._M_p)->filters).
    super__Vector_base<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (((CoreObject *)local_88._M_dataplus._M_p)->coreptr).
    super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (((CoreObject *)local_88._M_dataplus._M_p)->coreptr).
    super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ((CoreObject *)local_88._M_dataplus._M_p)->index = 0;
    ((CoreObject *)local_88._M_dataplus._M_p)->valid = 0;
    ((CoreObject *)local_88._M_dataplus._M_p)->valid = 0x378424ec;
    pcVar5 = (char *)gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var9 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (name != (char *)0x0) {
      pcVar5 = (char *)strlen(name);
      _Var9._M_p = name;
    }
    if (pcVar5 == (char *)0x0) {
      sVar4 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      _Var9._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
      if (initString != (char *)0x0) {
        sVar4 = strlen(initString);
        _Var9._M_p = initString;
      }
      configureString_00._M_str = _Var9._M_p;
      configureString_00._M_len = sVar4;
      helics::CoreFactory::create
                ((CoreFactory *)&stack0xffffffffffffff58,type_01,configureString_00);
    }
    else {
      pcVar3 = (char *)gHelicsEmptyStr_abi_cxx11_._M_string_length;
      if (initString != (char *)0x0) {
        pcVar3 = (char *)strlen(initString);
      }
      coreName._M_len = (ulong)type_01;
      coreName._M_str = pcVar5;
      configureString._M_str = pcVar3;
      configureString._M_len = (size_t)_Var9._M_p;
      helics::CoreFactory::FindOrCreate((CoreType)&stack0xffffffffffffff58,coreName,configureString)
      ;
    }
    this_00 = (MasterObjectHolder *)0x0;
    this = (((shared_ptr<helics::Core> *)local_88._M_dataplus._M_p)->
           super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (((shared_ptr<helics::Core> *)local_88._M_dataplus._M_p)->
    super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = in_stack_ffffffffffffff58
    ;
    (((shared_ptr<helics::Core> *)local_88._M_dataplus._M_p)->
    super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Stack_a0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    _Var8._M_head_impl = (CoreObject *)local_88._M_dataplus._M_p;
    getMasterHolder();
    local_68._M_t.
    super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
    super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl =
         (tuple<helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)
         (tuple<helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)
         local_88._M_dataplus._M_p;
    local_88._M_dataplus._M_p = (pointer)0x0;
    MasterObjectHolder::addCore
              (this_00,(unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                       &local_68);
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)&local_68
              );
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)&local_88
              );
  }
  else {
LAB_00194edd:
    _Var8._M_head_impl = (CoreObject *)0x0;
  }
  return _Var8._M_head_impl;
}

Assistant:

HelicsCore helicsCreateCore(const char* type, const char* name, const char* initString, HelicsError* err)
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }

    const helics::CoreType coretype = (type != nullptr) ? helics::core::coreTypeFromString(type) : helics::CoreType::DEFAULT;

    if (coretype == helics::CoreType::UNRECOGNIZED) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString(std::string("core type ") + type + " is not recognized");
        }
        return nullptr;
    }
    try {
        auto core = std::make_unique<helics::CoreObject>();
        core->valid = gCoreValidationIdentifier;
        auto nstring = AS_STRING_VIEW(name);
        if (nstring.empty()) {
            core->coreptr = helics::CoreFactory::create(coretype, AS_STRING_VIEW(initString));
        } else {
            core->coreptr = helics::CoreFactory::FindOrCreate(coretype, nstring, AS_STRING_VIEW(initString));
        }

        auto* retcore = reinterpret_cast<HelicsCore>(core.get());
        getMasterHolder()->addCore(std::move(core));
        return retcore;
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}